

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void new_localvar(LexState *ls,TString *name)

{
  FuncState *fs_00;
  Dyndata *pDVar1;
  Proto *o;
  LocVar *pLVar2;
  Vardesc *block;
  int iVar3;
  LocVar *pLVar4;
  short sVar5;
  long lVar6;
  FuncState *fs;
  
  fs_00 = ls->fs;
  pDVar1 = ls->dyd;
  o = fs_00->f;
  iVar3 = o->sizelocvars;
  lVar6 = (long)iVar3;
  if (fs_00->nlocvars < iVar3) {
    pLVar2 = o->locvars;
  }
  else {
    pLVar2 = (LocVar *)luaM_growaux_(ls->L,o->locvars,&o->sizelocvars,0x10,0x7fff,"local variables")
    ;
    o->locvars = pLVar2;
    iVar3 = o->sizelocvars;
  }
  pLVar4 = pLVar2 + lVar6;
  for (; lVar6 < iVar3; lVar6 = lVar6 + 1) {
    pLVar4->varname = (TString *)0x0;
    pLVar4 = pLVar4 + 1;
  }
  sVar5 = fs_00->nlocvars;
  pLVar2[sVar5].varname = name;
  if (((o->marked & 4) != 0) && ((name->marked & 3) != 0)) {
    luaC_barrier_(ls->L,(GCObject *)o,(GCObject *)name);
    sVar5 = fs_00->nlocvars;
  }
  fs_00->nlocvars = sVar5 + 1;
  checklimit(fs_00,((pDVar1->actvar).n - fs_00->firstlocal) + 1,200,"local variables");
  iVar3 = (pDVar1->actvar).n;
  block = (pDVar1->actvar).arr;
  if ((pDVar1->actvar).size < iVar3 + 2) {
    block = (Vardesc *)
            luaM_growaux_(ls->L,block,&(pDVar1->actvar).size,2,0x7fffffff,"local variables");
    (pDVar1->actvar).arr = block;
    iVar3 = (pDVar1->actvar).n;
  }
  (pDVar1->actvar).n = iVar3 + 1;
  block[iVar3].idx = sVar5;
  return;
}

Assistant:

static void new_localvar(LexState *ls, TString *name) {
    FuncState *fs = ls->fs;
    Dyndata *dyd = ls->dyd;
    int reg = registerlocalvar(ls, name);
    checklimit(fs, dyd->actvar.n + 1 - fs->firstlocal,
               MAXVARS, "local variables");
    luaM_growvector(ls->L, dyd->actvar.arr, dyd->actvar.n + 1,
                    dyd->actvar.size, Vardesc, MAX_INT, "local variables");
    dyd->actvar.arr[dyd->actvar.n++].idx = cast(short, reg);
}